

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CLI11.hpp
# Opt level: O1

void __thiscall CLI::App::~App(App *this)

{
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var1;
  pointer pcVar2;
  pointer ppAVar3;
  pointer ppOVar4;
  _Manager_type p_Var5;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar6;
  
  this->_vptr_App = (_func_int **)&PTR__App_004c8cb8;
  p_Var1 = (this->config_formatter_).super___shared_ptr<CLI::Config,_(__gnu_cxx::_Lock_policy)2>.
           _M_refcount._M_pi;
  if (p_Var1 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var1);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&this->aliases_);
  pcVar2 = (this->group_)._M_dataplus._M_p;
  paVar6 = &(this->group_).field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar2 != paVar6) {
    operator_delete(pcVar2,paVar6->_M_allocated_capacity + 1);
  }
  std::vector<std::shared_ptr<CLI::App>,_std::allocator<std::shared_ptr<CLI::App>_>_>::~vector
            (&this->subcommands_);
  std::
  _Rb_tree<CLI::Option_*,_CLI::Option_*,_std::_Identity<CLI::Option_*>,_std::less<CLI::Option_*>,_std::allocator<CLI::Option_*>_>
  ::~_Rb_tree(&(this->need_options_)._M_t);
  std::
  _Rb_tree<CLI::App_*,_CLI::App_*,_std::_Identity<CLI::App_*>,_std::less<CLI::App_*>,_std::allocator<CLI::App_*>_>
  ::~_Rb_tree(&(this->need_subcommands_)._M_t);
  std::
  _Rb_tree<CLI::Option_*,_CLI::Option_*,_std::_Identity<CLI::Option_*>,_std::less<CLI::Option_*>,_std::allocator<CLI::Option_*>_>
  ::~_Rb_tree(&(this->exclude_options_)._M_t);
  std::
  _Rb_tree<CLI::App_*,_CLI::App_*,_std::_Identity<CLI::App_*>,_std::less<CLI::App_*>,_std::allocator<CLI::App_*>_>
  ::~_Rb_tree(&(this->exclude_subcommands_)._M_t);
  ppAVar3 = (this->parsed_subcommands_).super__Vector_base<CLI::App_*,_std::allocator<CLI::App_*>_>.
            _M_impl.super__Vector_impl_data._M_start;
  if (ppAVar3 != (pointer)0x0) {
    operator_delete(ppAVar3,(long)(this->parsed_subcommands_).
                                  super__Vector_base<CLI::App_*,_std::allocator<CLI::App_*>_>.
                                  _M_impl.super__Vector_impl_data._M_end_of_storage - (long)ppAVar3)
    ;
  }
  ppOVar4 = (this->parse_order_).super__Vector_base<CLI::Option_*,_std::allocator<CLI::Option_*>_>.
            _M_impl.super__Vector_impl_data._M_start;
  if (ppOVar4 != (pointer)0x0) {
    operator_delete(ppOVar4,(long)(this->parse_order_).
                                  super__Vector_base<CLI::Option_*,_std::allocator<CLI::Option_*>_>.
                                  _M_impl.super__Vector_impl_data._M_end_of_storage - (long)ppOVar4)
    ;
  }
  std::
  vector<std::pair<CLI::detail::Classifier,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<CLI::detail::Classifier,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~vector(&this->missing_);
  p_Var5 = (this->failure_message_).super__Function_base._M_manager;
  if (p_Var5 != (_Manager_type)0x0) {
    (*p_Var5)((_Any_data *)&this->failure_message_,(_Any_data *)&this->failure_message_,
              __destroy_functor);
  }
  p_Var1 = (this->formatter_).super___shared_ptr<CLI::FormatterBase,_(__gnu_cxx::_Lock_policy)2>.
           _M_refcount._M_pi;
  if (p_Var1 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var1);
  }
  p_Var5 = (this->footer_callback_).super__Function_base._M_manager;
  if (p_Var5 != (_Manager_type)0x0) {
    (*p_Var5)((_Any_data *)&this->footer_callback_,(_Any_data *)&this->footer_callback_,
              __destroy_functor);
  }
  pcVar2 = (this->footer_)._M_dataplus._M_p;
  paVar6 = &(this->footer_).field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar2 != paVar6) {
    operator_delete(pcVar2,paVar6->_M_allocated_capacity + 1);
  }
  p_Var5 = (this->usage_callback_).super__Function_base._M_manager;
  if (p_Var5 != (_Manager_type)0x0) {
    (*p_Var5)((_Any_data *)&this->usage_callback_,(_Any_data *)&this->usage_callback_,
              __destroy_functor);
  }
  pcVar2 = (this->usage_)._M_dataplus._M_p;
  paVar6 = &(this->usage_).field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar2 != paVar6) {
    operator_delete(pcVar2,paVar6->_M_allocated_capacity + 1);
  }
  std::
  vector<std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>,_std::allocator<std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>_>_>
  ::~vector(&this->options_);
  pcVar2 = (this->option_defaults_).super_OptionBase<CLI::OptionDefaults>.group_._M_dataplus._M_p;
  paVar6 = &(this->option_defaults_).super_OptionBase<CLI::OptionDefaults>.group_.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar2 != paVar6) {
    operator_delete(pcVar2,paVar6->_M_allocated_capacity + 1);
  }
  p_Var5 = (this->final_callback_).super__Function_base._M_manager;
  if (p_Var5 != (_Manager_type)0x0) {
    (*p_Var5)((_Any_data *)&this->final_callback_,(_Any_data *)&this->final_callback_,
              __destroy_functor);
  }
  p_Var5 = (this->parse_complete_callback_).super__Function_base._M_manager;
  if (p_Var5 != (_Manager_type)0x0) {
    (*p_Var5)((_Any_data *)&this->parse_complete_callback_,
              (_Any_data *)&this->parse_complete_callback_,__destroy_functor);
  }
  p_Var5 = (this->pre_parse_callback_).super__Function_base._M_manager;
  if (p_Var5 != (_Manager_type)0x0) {
    (*p_Var5)((_Any_data *)&this->pre_parse_callback_,(_Any_data *)&this->pre_parse_callback_,
              __destroy_functor);
  }
  pcVar2 = (this->description_)._M_dataplus._M_p;
  paVar6 = &(this->description_).field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar2 != paVar6) {
    operator_delete(pcVar2,paVar6->_M_allocated_capacity + 1);
  }
  pcVar2 = (this->name_)._M_dataplus._M_p;
  paVar6 = &(this->name_).field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar2 != paVar6) {
    operator_delete(pcVar2,paVar6->_M_allocated_capacity + 1);
    return;
  }
  return;
}

Assistant:

virtual ~App() = default;